

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_data.hpp
# Opt level: O0

bool ex::readDataSet(string *dir_name,
                    vector<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
                    *points,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *answers,
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
                    *distances)

{
  bool bVar1;
  byte bVar2;
  type this;
  string *psVar3;
  ostream *poVar4;
  istream *piVar5;
  size_type sVar6;
  reference pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  WeightVectorPhrase *this_01;
  byte local_3ea;
  byte local_39c;
  shared_ptr<wv::AbstractWeightVector> local_388;
  undefined1 local_378 [8];
  shared_ptr<wv::WeightVectorPhrase> swv;
  uint local_344;
  undefined1 local_340 [4];
  uint32_t i;
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> arr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  concr_phrase;
  string line;
  long local_2f0;
  ifstream fi;
  path local_e8;
  path *local_c8;
  path *p;
  bool _foreach_continue34;
  auto_any_base *local_b0;
  auto_any_t _foreach_end34;
  auto_any_base *local_a0;
  auto_any_t _foreach_cur34;
  pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> local_88;
  pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> *local_78;
  auto_any_t _foreach_col34;
  directory_iterator eod;
  directory_iterator local_58;
  directory_iterator it;
  path targetDir;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
  *distances_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *answers_local;
  vector<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
  *points_local;
  string *dir_name_local;
  
  boost::filesystem::path::path((path *)&it,dir_name);
  boost::filesystem::directory_iterator::directory_iterator(&local_58,(path *)&it,none);
  boost::filesystem::directory_iterator::directory_iterator((directory_iterator *)&_foreach_col34);
  std::make_pair<boost::filesystem::directory_iterator&,boost::filesystem::directory_iterator&>
            ((directory_iterator *)&_foreach_cur34,&local_58);
  boost::foreach_detail_::
  contain<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>>
            (&local_88,(true_ *)&_foreach_cur34);
  std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>::~pair
            ((pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> *)
             &_foreach_cur34);
  local_78 = &local_88;
  bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool((auto_any_base *)local_78);
  if (!bVar1) {
    boost::foreach_detail_::
    begin<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
              ((foreach_detail_ *)&_foreach_end34,(auto_any_t)local_78,
               (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                *)0x0,(true_ *)0x0);
    local_a0 = (auto_any_base *)&_foreach_end34;
    bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_a0);
    if (bVar1) {
LAB_001390e3:
      bVar1 = false;
    }
    else {
      boost::foreach_detail_::
      end<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                ((foreach_detail_ *)&stack0xffffffffffffff48,(auto_any_t)local_78,
                 (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                  *)0x0,(true_ *)0x0);
      local_b0 = (auto_any_base *)&stack0xffffffffffffff48;
      bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_b0);
      if (!bVar1) {
        p._7_1_ = 1;
        while( true ) {
          local_39c = 0;
          if ((p._7_1_ & 1) != 0) {
            bVar1 = boost::foreach_detail_::
                    done<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                              (local_a0,local_b0,
                               (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                                *)0x0);
            local_39c = bVar1 ^ 0xff;
          }
          if ((local_39c & 1) == 0) break;
          bVar1 = boost::foreach_detail_::set_false((bool *)((long)&p + 7));
          if (!bVar1) {
            this = boost::foreach_detail_::
                   deref<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                             (local_a0,(type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                                        *)0x0);
            local_c8 = boost::filesystem::directory_entry::operator_cast_to_path_(this);
            while (((p._7_1_ ^ 0xff) & 1) != 0) {
              bVar1 = boost::filesystem::is_regular_file(local_c8);
              if (bVar1) {
                boost::filesystem::path::extension();
                bVar1 = boost::filesystem::operator==(&local_e8,"swp");
                boost::filesystem::path::~path(&local_e8);
                if (!bVar1) {
                  psVar3 = boost::filesystem::path::string_abi_cxx11_(local_c8);
                  std::ifstream::ifstream(&local_2f0,(string *)psVar3,_S_in);
                  bVar2 = std::ios::operator!((ios *)((long)&local_2f0 +
                                                     *(long *)(local_2f0 + -0x18)));
                  if ((bVar2 & 1) == 0) {
                    std::__cxx11::string::string
                              ((string *)
                               &concr_phrase.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&arr.m_Size);
                    while( true ) {
                      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                         ((istream *)&local_2f0,
                                          (string *)
                                          &concr_phrase.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      bVar1 = std::ios::operator_cast_to_bool
                                        ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
                      local_3ea = 0;
                      if (bVar1) {
                        local_3ea = std::__cxx11::string::empty();
                        local_3ea = local_3ea ^ 0xff;
                      }
                      if ((local_3ea & 1) == 0) break;
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&arr.m_Size,
                                  (value_type *)
                                  &concr_phrase.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    }
                    sVar6 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&arr.m_Size);
                    cont::
                    StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_340,(uint32_t)sVar6);
                    for (local_344 = 0;
                        sVar6 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&arr.m_Size), local_344 < sVar6; local_344 = local_344 + 1
                        ) {
                      pvVar7 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&arr.m_Size,(ulong)local_344);
                      this_00 = cont::
                                StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator[]((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)local_340,local_344);
                      std::__cxx11::string::operator=((string *)this_00,(string *)pvVar7);
                    }
                    boost::filesystem::path::filename();
                    psVar3 = boost::filesystem::path::string_abi_cxx11_
                                       ((path *)&swv.
                                                 super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(answers,psVar3);
                    boost::filesystem::path::~path
                              ((path *)&swv.
                                        super___shared_ptr<wv::WeightVectorPhrase,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                    this_01 = (WeightVectorPhrase *)operator_new(0x20);
                    wv::WeightVectorPhrase::WeightVectorPhrase
                              (this_01,(StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_340,distances);
                    std::shared_ptr<wv::WeightVectorPhrase>::shared_ptr<wv::WeightVectorPhrase,void>
                              ((shared_ptr<wv::WeightVectorPhrase> *)local_378,this_01);
                    std::shared_ptr<wv::AbstractWeightVector>::
                    shared_ptr<wv::WeightVectorPhrase,void>
                              (&local_388,(shared_ptr<wv::WeightVectorPhrase> *)local_378);
                    std::
                    vector<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
                    ::push_back(points,&local_388);
                    std::shared_ptr<wv::AbstractWeightVector>::~shared_ptr(&local_388);
                    std::shared_ptr<wv::WeightVectorPhrase>::~shared_ptr
                              ((shared_ptr<wv::WeightVectorPhrase> *)local_378);
                    cont::
                    StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_340);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&arr.m_Size);
                    std::__cxx11::string::~string
                              ((string *)
                               &concr_phrase.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    bVar1 = false;
                  }
                  else {
                    poVar4 = std::operator<<((ostream *)&std::cerr,"File ");
                    psVar3 = boost::filesystem::path::string_abi_cxx11_(local_c8);
                    poVar4 = std::operator<<(poVar4,(string *)psVar3);
                    poVar4 = std::operator<<(poVar4,"doesn\'t exist");
                    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                    dir_name_local._7_1_ = 0;
                    bVar1 = true;
                  }
                  std::ifstream::~ifstream(&local_2f0);
                  if (bVar1) goto LAB_001390bb;
                }
              }
              p._7_1_ = 1;
            }
          }
          if ((p._7_1_ & 1) != 0) {
            boost::foreach_detail_::
            next<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                      (local_a0,(type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                                 *)0x0);
          }
        }
      }
      bVar1 = false;
LAB_001390bb:
      boost::foreach_detail_::auto_any<boost::filesystem::directory_iterator>::~auto_any
                ((auto_any<boost::filesystem::directory_iterator> *)&stack0xffffffffffffff48);
      if (!bVar1) goto LAB_001390e3;
    }
    boost::foreach_detail_::auto_any<boost::filesystem::directory_iterator>::~auto_any
              ((auto_any<boost::filesystem::directory_iterator> *)&_foreach_end34);
    if (bVar1) goto LAB_0013911f;
  }
  bVar1 = false;
LAB_0013911f:
  boost::foreach_detail_::
  auto_any<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>_>
  ::~auto_any((auto_any<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>_>
               *)&local_88);
  if (!bVar1) {
    dir_name_local._7_1_ = 1;
  }
  boost::filesystem::directory_iterator::~directory_iterator((directory_iterator *)&_foreach_col34);
  boost::filesystem::directory_iterator::~directory_iterator(&local_58);
  boost::filesystem::path::~path((path *)&it);
  return (bool)(dir_name_local._7_1_ & 1);
}

Assistant:

bool readDataSet(const std::string& dir_name, std::vector<std::shared_ptr<wv::Point>>& points, std::vector<std::string>& answers, const std::unordered_map<std::string, std::unordered_map<std::string, double>>& distances)
    {
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                std::vector<std::string> concr_phrase;
                while (std::getline(fi, line) and !line.empty())
                {
                    concr_phrase.push_back(line);
                }
                
                cont::StaticArray<std::string> arr(concr_phrase.size());
                for (uint32_t i = 0; i < concr_phrase.size(); i++)
                    arr[i] = concr_phrase[i];
                    
                answers.push_back(p.filename().string());
                std::shared_ptr<wv::WeightVectorPhrase> swv(new wv::WeightVectorPhrase(arr, distances));
                points.push_back(swv);
            } 
        }
        return true;
    }